

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

bool __thiscall
GrcSymbolTableEntry::AdjustExpTypeIfPossible(GrcSymbolTableEntry *this,ExpressionType expt)

{
  ExpressionType expt_local;
  GrcSymbolTableEntry *this_local;
  bool local_1;
  
  if (this->m_expt == kexptUnknown) {
    this->m_expt = expt;
    local_1 = true;
  }
  else if (this->m_expt == expt) {
    local_1 = true;
  }
  else if ((this->m_expt == kexptZero) &&
          (((expt == kexptNumber || (expt == kexptMeas)) || (expt == kexptBoolean)))) {
    this->m_expt = expt;
    local_1 = true;
  }
  else if ((this->m_expt == kexptOne) && ((expt == kexptNumber || (expt == kexptBoolean)))) {
    this->m_expt = expt;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GrcSymbolTableEntry::AdjustExpTypeIfPossible(ExpressionType expt)
{
	if (m_expt == kexptUnknown)
	{
		m_expt = expt;
		return true;
	}
	if (m_expt == expt)
	{
		return true;
	}
	if (m_expt == kexptZero && (expt == kexptNumber || expt == kexptMeas || expt == kexptBoolean))
	{
		m_expt = expt;
		return true;
	}
	if (m_expt == kexptOne && (expt == kexptNumber || expt == kexptBoolean))
	{
		m_expt = expt;
		return true;
	}
	return false;
}